

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O1

Expression
dynet::detail::f<dynet::Concatenate,std::initializer_list<dynet::Expression>,unsigned_int>
          (initializer_list<dynet::Expression> *xs,uint *arg1)

{
  pointer *pppNVar1;
  uint uVar2;
  ComputationGraph *this;
  size_type sVar3;
  iterator pEVar4;
  iterator __position;
  VariableIndex VVar5;
  Node *pNVar6;
  pointer puVar7;
  long lVar8;
  Expression EVar9;
  VariableIndex new_node_index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> xis;
  allocator_type local_45;
  VariableIndex local_44;
  Node *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  this = xs->_M_array->pg;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_38,xs->_M_len,(allocator_type *)&local_40);
  sVar3 = xs->_M_len;
  if (sVar3 != 0) {
    pEVar4 = xs->_M_array;
    lVar8 = 0;
    puVar7 = local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      *puVar7 = *(uint *)((long)&pEVar4->i + lVar8);
      puVar7 = puVar7 + 1;
      lVar8 = lVar8 + 0x10;
    } while (sVar3 << 4 != lVar8);
  }
  local_44 = (VariableIndex)
             ((ulong)((long)(this->nodes).
                            super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->nodes).
                           super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3);
  pNVar6 = (Node *)operator_new(0x80);
  uVar2 = *arg1;
  pNVar6->_vptr_Node = (_func_int **)&PTR__Node_005bafc8;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pNVar6->args,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_45);
  (pNVar6->dim).nd = 0;
  (pNVar6->dim).bd = 1;
  pNVar6->device = (Device *)0x0;
  pNVar6->_vptr_Node = (_func_int **)&PTR__Concatenate_005bcb58;
  pNVar6[1]._vptr_Node = (_func_int **)0x0;
  pNVar6[1].args.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pNVar6[1].args.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(uint *)&pNVar6[1].args.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = uVar2;
  __position._M_current =
       (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_40 = pNVar6;
  if (__position._M_current ==
      (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<dynet::Node*,std::allocator<dynet::Node*>>::_M_realloc_insert<dynet::Node*>
              ((vector<dynet::Node*,std::allocator<dynet::Node*>> *)this,__position,&local_40);
  }
  else {
    *__position._M_current = pNVar6;
    pppNVar1 = &(this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish[-1]->device = dynet::default_device;
  ComputationGraph::set_dim_for_new_node(this,&local_44);
  VVar5 = local_44;
  uVar2 = this->graph_id;
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  EVar9.graph_id = uVar2;
  EVar9.i = VVar5;
  EVar9.pg = this;
  return EVar9;
}

Assistant:

Expression f(const T& xs, const T1& arg1) {
  ComputationGraph *pg = xs.begin()->pg;
  std::vector<VariableIndex> xis(xs.size());
  int i = 0;
  for (auto xi = xs.begin(); xi != xs.end(); ++xi) xis[i++] = xi->i;
  return Expression(pg, pg->add_function<F>(xis, arg1));
}